

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O2

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2;
  SyntaxNode *args_5;
  EventTriggerStatementSyntax *pEVar1;
  NamedLabelSyntax *local_58;
  Token local_50;
  SyntaxNode *local_40;
  Token local_38;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_58 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_58 = (NamedLabelSyntax *)
               deepClone(*(SyntaxNode **)(__fn + 0x18),(BumpAllocator *)__child_stack);
  }
  args_2 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x68) == (SyntaxNode *)0x0) {
    local_40 = (SyntaxNode *)0x0;
  }
  else {
    local_40 = deepClone(*(SyntaxNode **)(__fn + 0x68),(BumpAllocator *)__child_stack);
  }
  args_5 = deepClone(*(SyntaxNode **)(__fn + 0x70),(BumpAllocator *)__child_stack);
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::EventTriggerStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::TimingControlSyntax*,slang::syntax::NameSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,&local_58,args_2,&local_50,
                      (TimingControlSyntax **)&local_40,(NameSyntax *)args_5,&local_38);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const EventTriggerStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<EventTriggerStatementSyntax>(
        node.kind,
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.trigger.deepClone(alloc),
        node.timing ? deepClone(*node.timing, alloc) : nullptr,
        *deepClone<NameSyntax>(*node.name, alloc),
        node.semi.deepClone(alloc)
    );
}